

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O2

weight * __thiscall sparse_parameters::operator[](sparse_parameters *this,size_t i)

{
  const_iterator cVar1;
  float **ppfVar2;
  uint64_t index;
  ulong local_10;
  
  local_10 = i & this->_weight_mask;
  cVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_10);
  ppfVar2 = (float **)
            ((long)cVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
                   _M_cur + 0x10);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    ppfVar2 = &this->default_value;
  }
  return *ppfVar2;
}

Assistant:

inline const weight& operator[](size_t i) const
  {
    uint64_t index = i & _weight_mask;
    weight_map::const_iterator iter = _map.find(index);
    if (iter == _map.end())
      return *default_value;
    return *(iter->second);
  }